

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

int __thiscall moira::Moira::disassemble(Moira *this,char *str,u32 addr)

{
  LetterCase LVar1;
  int iVar2;
  long *plVar3;
  code *local_a0;
  char *local_80;
  char *p_1;
  char *p;
  undefined1 local_68 [8];
  StrWriter writer;
  u32 local_20;
  u32 uStack_1c;
  u16 opcode;
  u32 pc;
  u32 addr_local;
  char *str_local;
  Moira *this_local;
  
  local_20 = addr;
  uStack_1c = addr;
  _pc = str;
  str_local = (char *)this;
  iVar2 = (*this->_vptr_Moira[6])(this,(ulong)addr);
  writer._62_2_ = SUB42(iVar2,0);
  StrWriter::StrWriter((StrWriter *)local_68,_pc,&this->instrStyle);
  local_a0 = (code *)this->dasm[(ulong)(ushort)writer._62_2_ * 2];
  plVar3 = (long *)((long)&this->_vptr_Moira + this->dasm[(ulong)(ushort)writer._62_2_ * 2 + 1]);
  if (((ulong)local_a0 & 1) != 0) {
    local_a0 = *(code **)(local_a0 + *plVar3 + -1);
  }
  (*local_a0)(plVar3,(StrWriter *)local_68,&local_20,writer._62_2_);
  StrWriter::operator<<((StrWriter *)local_68);
  LVar1 = (this->instrStyle).letterCase;
  if (LVar1 != MIXED_CASE) {
    if (LVar1 == LOWER_CASE) {
      for (p_1 = (char *)writer.comment._24_8_; p_1 < writer.base; p_1 = p_1 + 1) {
        iVar2 = tolower((int)*p_1);
        *p_1 = (char)iVar2;
      }
    }
    else if (LVar1 == UPPER_CASE) {
      for (local_80 = (char *)writer.comment._24_8_; local_80 < writer.base; local_80 = local_80 + 1
          ) {
        iVar2 = toupper((int)*local_80);
        *local_80 = (char)iVar2;
      }
    }
  }
  return (local_20 - uStack_1c) + 2;
}

Assistant:

int
Moira::disassemble(char *str, u32 addr) const
{
    if constexpr (MOIRA_ENABLE_DASM == false) {
        throw std::runtime_error("This feature requires MOIRA_ENABLE_DASM = true\n");
    }

    u32 pc = addr;
    u16 opcode = read16Dasm(pc);

    StrWriter writer(str, instrStyle);

    (this->*dasm[opcode])(writer, pc, opcode);
    writer << Finish{};

    // Post process disassembler output
    switch (instrStyle.letterCase) {

        case LetterCase::MIXED_CASE:

            break;

        case LetterCase::LOWER_CASE:

            for (auto p = writer.base; p < writer.ptr; p++) {
                *p = char(std::tolower(*p));
            }
            break;

        case LetterCase::UPPER_CASE:

            for (auto p = writer.base; p < writer.ptr; p++) {
                *p = char(std::toupper(*p));
            }
            break;
    }

    return pc - addr + 2;
}